

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.h
# Opt level: O0

void __thiscall glslang::TPpContext::pushInput(TPpContext *this,tInput *in)

{
  tInput *local_18;
  tInput *in_local;
  TPpContext *this_local;
  
  local_18 = in;
  in_local = (tInput *)this;
  std::vector<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>::
  push_back(&this->inputStack,&local_18);
  (*local_18->_vptr_tInput[10])();
  return;
}

Assistant:

void pushInput(tInput* in)
    {
        inputStack.push_back(in);
        in->notifyActivated();
    }